

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractContentContext.cpp
# Opt level: O2

int __thiscall AbstractContentContext::c(AbstractContentContext *this,void *param_1,void *param_2)

{
  PrimitiveObjectsWriter *this_00;
  EStatusCode EVar1;
  double in_XMM0_Qa;
  double in_XMM1_Qa;
  double in_XMM2_Qa;
  double in_XMM3_Qa;
  double in_XMM4_Qa;
  double in_XMM5_Qa;
  allocator<char> local_69;
  double local_68;
  double local_60;
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  string local_38;
  
  local_68 = in_XMM0_Qa;
  local_60 = in_XMM1_Qa;
  local_58 = in_XMM2_Qa;
  local_50 = in_XMM3_Qa;
  local_48 = in_XMM4_Qa;
  local_40 = in_XMM5_Qa;
  EVar1 = (*this->_vptr_AbstractContentContext[5])();
  if (EVar1 != eSuccess) {
    this->mCurrentStatusCode = EVar1;
  }
  AssertProcsetAvailable(this,&KProcsetPDF_abi_cxx11_);
  this_00 = &this->mPrimitiveWriter;
  PrimitiveObjectsWriter::WriteDouble(this_00,local_68,eTokenSeparatorSpace);
  PrimitiveObjectsWriter::WriteDouble(this_00,local_60,eTokenSeparatorSpace);
  PrimitiveObjectsWriter::WriteDouble(this_00,local_58,eTokenSeparatorSpace);
  PrimitiveObjectsWriter::WriteDouble(this_00,local_50,eTokenSeparatorSpace);
  PrimitiveObjectsWriter::WriteDouble(this_00,local_48,eTokenSeparatorSpace);
  PrimitiveObjectsWriter::WriteDouble(this_00,local_40,eTokenSeparatorSpace);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"c",&local_69);
  PrimitiveObjectsWriter::WriteKeyword(this_00,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return this->mCurrentStatusCode;
}

Assistant:

EStatusCode AbstractContentContext::c(	double inX1,double inY1, 
							double inX2, double inY2, 
							double inX3, double inY3)
{
	RenewStreamConnectAndStoreResult();
	AssertProcsetAvailable(KProcsetPDF);

	mPrimitiveWriter.WriteDouble(inX1);
	mPrimitiveWriter.WriteDouble(inY1);
	mPrimitiveWriter.WriteDouble(inX2);
	mPrimitiveWriter.WriteDouble(inY2);
	mPrimitiveWriter.WriteDouble(inX3);
	mPrimitiveWriter.WriteDouble(inY3);
	mPrimitiveWriter.WriteKeyword("c");
	return GetCurrentStatusCode();
}